

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav * drwav_open_memory_ex
                  (void *data,size_t dataSize,drwav_chunk_proc onChunk,void *pChunkUserData,
                  drwav_uint32 flags)

{
  drwav_read_proc in_RCX;
  void *in_RSI;
  drwav_uint8 *in_RDI;
  undefined4 in_R8D;
  drwav *pWav;
  drwav__memory_stream memoryStream;
  undefined8 in_stack_ffffffffffffffb0;
  size_t sVar1;
  undefined4 in_stack_ffffffffffffffd0;
  drwav *local_8;
  
  if ((in_RDI == (drwav_uint8 *)0x0) || (in_RSI == (void *)0x0)) {
    local_8 = (drwav *)0x0;
  }
  else {
    memset(&stack0xffffffffffffffb8,0,0x18);
    sVar1 = 0;
    local_8 = drwav_open_ex(in_RCX,(drwav_seek_proc)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                            (drwav_chunk_proc)0x0,in_RSI,in_RDI,
                            (drwav_uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    if (local_8 == (drwav *)0x0) {
      local_8 = (drwav *)0x0;
    }
    else {
      (local_8->memoryStream).data = in_RDI;
      (local_8->memoryStream).dataSize = (size_t)in_RSI;
      (local_8->memoryStream).currentReadPos = sVar1;
      local_8->pUserData = &local_8->memoryStream;
    }
  }
  return local_8;
}

Assistant:

drwav* drwav_open_memory_ex(const void* data, size_t dataSize, drwav_chunk_proc onChunk, void* pChunkUserData, drwav_uint32 flags)
{
    if (data == NULL || dataSize == 0) {
        return NULL;
    }

    drwav__memory_stream memoryStream;
    drwav_zero_memory(&memoryStream, sizeof(memoryStream));
    memoryStream.data = (const unsigned char*)data;
    memoryStream.dataSize = dataSize;
    memoryStream.currentReadPos = 0;

    drwav* pWav = drwav_open_ex(drwav__on_read_memory, drwav__on_seek_memory, onChunk, (void*)&memoryStream, pChunkUserData, flags);
    if (pWav == NULL) {
        return NULL;
    }

    pWav->memoryStream = memoryStream;
    pWav->pUserData = &pWav->memoryStream;
    return pWav;
}